

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool ON_SubDRTreeVertexFinder::Callback(void *a_context,ON__INT_PTR a_id)

{
  double dVar1;
  char cVar2;
  bool bVar3;
  ON__UINT8 OVar4;
  byte bVar5;
  byte in_CL;
  ON_SubDVertex *v;
  double dVar6;
  ON_3dPoint OStack_58;
  ON_3dVector local_40;
  
  if (a_id == 0) {
    bVar5 = 1;
    goto LAB_005a5724;
  }
  if ((*(char *)((long)a_context + 0x28) == '\x01') &&
     (cVar2 = *(char *)((long)a_context + 0x29),
     bVar3 = ON_SubDComponentBase::Mark((ON_SubDComponentBase *)a_id), (bool)cVar2 != bVar3))
  goto LAB_005a5714;
  if (*(char *)((long)a_context + 0x2a) != '\0') {
    OVar4 = ON_SubDComponentBase::MarkBits((ON_SubDComponentBase *)a_id);
    if (*(char *)((long)a_context + 0x2a) == '\x02') {
      if (*(ON__UINT8 *)((long)a_context + 0x2b) != OVar4) goto LAB_005a568b;
    }
    else if ((*(char *)((long)a_context + 0x2a) != '\x01') ||
            (*(ON__UINT8 *)((long)a_context + 0x2b) == OVar4)) goto LAB_005a568b;
LAB_005a5714:
    in_CL = 1;
    bVar5 = 0;
    goto LAB_005a5724;
  }
LAB_005a568b:
  ON_SubDVertex::ControlNetPoint(&OStack_58,(ON_SubDVertex *)a_id);
  ON_3dPoint::operator-(&local_40,(ON_3dPoint *)a_context,&OStack_58);
  dVar6 = ON_3dVector::MaximumCoordinate(&local_40);
  if (0.0 <= dVar6) {
    if ((*(long *)((long)a_context + 0x20) == 0) ||
       (dVar1 = *(double *)((long)a_context + 0x18), dVar6 < dVar1)) {
LAB_005a56e3:
      *(ON__INT_PTR *)((long)a_context + 0x20) = a_id;
      *(double *)((long)a_context + 0x18) = dVar6;
    }
    else if ((dVar6 == dVar1) &&
            ((!NAN(dVar6) && !NAN(dVar1) &&
             (*(uint *)(a_id + 8) < *(uint *)(*(long *)((long)a_context + 0x20) + 8)))))
    goto LAB_005a56e3;
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      bVar5 = 0;
      in_CL = 0;
      goto LAB_005a5724;
    }
  }
  bVar5 = 1;
  in_CL = 1;
LAB_005a5724:
  return (bool)(bVar5 | in_CL & 1);
}

Assistant:

bool ON_SubDRTreeVertexFinder::Callback(void* a_context, ON__INT_PTR a_id)
{
  for (;;)
  {
    ON_SubDRTreeVertexFinder* vf = (ON_SubDRTreeVertexFinder*)a_context;
    const ON_SubDVertex* v = (const ON_SubDVertex*)a_id;
    if (nullptr == v )
      break;

    if (vf->m_bMarkFilterEnabled && vf->m_bMarkFilter != v->Mark())
    {
      // v is not eligible.
      // Returning true means continue searching for other vertices
      return true;
    }

    if (ON_SubDRTreeVertexFinder::MarkBitsFilter::None != vf->m_mark_bits_filter)
    {
      const ON__UINT8 v_mark_bits = v->MarkBits();
      switch(vf->m_mark_bits_filter)
      {
      case ON_SubDRTreeVertexFinder::MarkBitsFilter::Equal:
        if (vf->m_mark_bits != v_mark_bits)
        {
          // v is not eligible.
          // Returning true means continue searching for other vertices
          return true;
        }
        break;

      case ON_SubDRTreeVertexFinder::MarkBitsFilter::NotEqual:
        if (vf->m_mark_bits == v_mark_bits)
        {
          // v is not eligible.
          // Returning true means continue searching for other vertices
          return true;
        }
        break;

      default:
        break;
      }
    }

    const double d = (vf->m_P - v->ControlNetPoint()).MaximumCoordinate();
    if (d >= 0.0)
    {
      if (nullptr == vf->m_v)
      {
        vf->m_v = v;
        vf->m_distance = d;
      }
      else
      {
        if (d < vf->m_distance || (d == vf->m_distance && v->m_id < vf->m_v->m_id))
        {
          vf->m_v = v;
          vf->m_distance = d;
        }
      }
      if (0.0 == d)
        return false; // can't get any closer. Stop searching.
    }
    break;
  }
  return true;
}